

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blitter.cpp
# Opt level: O0

bool __thiscall E64::blitter_ic::run_next_operation(blitter_ic *this)

{
  blitter_ic *in_RDI;
  blitter_ic *in_stack_00000020;
  bool local_1;
  
  if (in_RDI->head == in_RDI->tail) {
    local_1 = false;
  }
  else {
    switch(in_RDI->operations[in_RDI->tail].type) {
    case CLEAR:
      clear_framebuffer(in_RDI);
      break;
    case HOR_BORDER:
      draw_horizontal_border(in_RDI);
      break;
    case VER_BORDER:
      draw_vertical_border(in_RDI);
      break;
    case BLIT:
      draw_blit(in_stack_00000020,(blit_t *)this);
    }
    in_RDI->tail = in_RDI->tail + 1;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool E64::blitter_ic::run_next_operation()
{
	if (head != tail) {
		switch (operations[tail].type) {
			case CLEAR:
				clear_framebuffer();
				break;
			case HOR_BORDER:
				draw_horizontal_border();
				break;
			case VER_BORDER:
				draw_vertical_border();
				break;
			case BLIT:
				draw_blit(&operations[tail].blit);
				break;
		}
		tail++;
		return true;
	} else {
		return false;
	}
}